

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall QRegularExpressionPrivate::compilePattern(QRegularExpressionPrivate *this)

{
  ulong uVar1;
  uint uVar2;
  QChar *pQVar3;
  qsizetype qVar4;
  pcre2_code_16 *ppVar5;
  QRegularExpressionPrivate *in_RDI;
  long in_FS_OFFSET;
  int options;
  size_t patternErrorOffset;
  QMutexLocker<QMutex> lock;
  undefined1 local_18 [4];
  QMutexLocker<QMutex> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (QMutexLocker<QMutex>)0xaa;
  QMutexLocker<QMutex>::QMutexLocker(&local_9,(QMutex *)&in_RDI->field_0x20);
  if ((in_RDI->isDirty & 1U) != 0) {
    in_RDI->isDirty = false;
    cleanCompiledPattern(in_RDI);
    uVar1 = (ulong)_local_18 >> 0x20;
    uVar2 = convertToPcreOptions
                      ((QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)SUB84(uVar1,0));
    _local_18 = -0x5555555555555556;
    pQVar3 = QString::constData((QString *)0x14e1f6);
    qVar4 = QString::size(&in_RDI->pattern);
    ppVar5 = (pcre2_code_16 *)
             pcre2_compile_16(pQVar3,qVar4,uVar2 | 0x80000,&in_RDI->errorCode,local_18,0);
    in_RDI->compiledPattern = ppVar5;
    if (in_RDI->compiledPattern == (pcre2_code_16 *)0x0) {
      in_RDI->errorOffset = _local_18;
    }
    else {
      in_RDI->errorCode = 0;
      optimizePattern(in_RDI);
      getPatternInfo(in_RDI);
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker(&local_9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRegularExpressionPrivate::compilePattern()
{
    const QMutexLocker lock(&mutex);

    if (!isDirty)
        return;

    isDirty = false;
    cleanCompiledPattern();

    int options = convertToPcreOptions(patternOptions);
    options |= PCRE2_UTF;

    PCRE2_SIZE patternErrorOffset;
    compiledPattern = pcre2_compile_16(reinterpret_cast<PCRE2_SPTR16>(pattern.constData()),
                                       pattern.size(),
                                       options,
                                       &errorCode,
                                       &patternErrorOffset,
                                       nullptr);

    if (!compiledPattern) {
        errorOffset = qsizetype(patternErrorOffset);
        return;
    } else {
        // ignore whatever PCRE2 wrote into errorCode -- leave it to 0 to mean "no error"
        errorCode = 0;
    }

    optimizePattern();
    getPatternInfo();
}